

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnumMethods.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::EnumNumMethod::eval
          (EnumNumMethod *this,EvalContext *context,Args *args,SourceRange param_4,
          SystemCallInfo *param_5)

{
  bool bVar1;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RCX;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_(std::ranges::subrange_kind)0>
  *in_RDI;
  EnumType *type;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  Type *in_stack_ffffffffffffff70;
  ConstantValue *this_00;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_(std::ranges::subrange_kind)0>
  *this_01;
  undefined1 in_stack_ffffffffffffffa8 [16];
  undefined8 in_stack_ffffffffffffffb8;
  
  this_01 = in_RDI;
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,0);
  bVar1 = SystemSubroutine::noHierarchical
                    ((SystemSubroutine *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffa8._8_8_,
                     in_stack_ffffffffffffffa8._0_8_);
  if (bVar1) {
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,0);
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x944378);
    Type::getCanonicalType(in_stack_ffffffffffffff70);
    Symbol::as<slang::ast::EnumType>((Symbol *)0x944388);
    EnumType::values((EnumType *)0x944397);
    std::ranges::__distance_fn::
    operator()<std::ranges::subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_(std::ranges::subrange_kind)0>_>
              ((__distance_fn *)this_01,in_RDI);
    this_00 = (ConstantValue *)&stack0xffffffffffffffb8;
    SVInt::SVInt((SVInt *)this_01,(bitwidth_t)((ulong)in_RDI >> 0x20),(uint64_t)this_00,
                 (bool)in_stack_ffffffffffffff6f);
    slang::ConstantValue::ConstantValue
              (this_00,(SVInt *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    SVInt::~SVInt((SVInt *)this_01);
  }
  else {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_ffffffffffffff70,
               (nullptr_t)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  }
  return (ConstantValue *)this_01;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo&) const final {
        if (!noHierarchical(context, *args[0]))
            return nullptr;

        // Expression isn't actually evaluated here; we know the value to return at compile time.
        const EnumType& type = args[0]->type->getCanonicalType().as<EnumType>();
        return SVInt(32, (uint64_t)std::ranges::distance(type.values()), true);
    }